

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O2

int uni_sem_new(uni_sem_t *sem,uint count)

{
  sem_t *__sem;
  int iVar1;
  
  if (sem == (uni_sem_t *)0x0) {
    iVar1 = -2;
  }
  else {
    __sem = (sem_t *)malloc(0x20);
    sem->hdl = __sem;
    if (__sem == (sem_t *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = 0;
      sem_init(__sem,0,count);
    }
  }
  return iVar1;
}

Assistant:

int uni_sem_new(uni_sem_t *sem, unsigned int count) {
    if (NULL_PTR_CHECK(sem)) {
        return -INVALID_IN_PARAM;
    }

    sem->hdl = malloc(sizeof(sem_t));
    if (NULL_PTR_CHECK(sem->hdl)) {
        return -OUT_OF_MEMORY;
    }

    sem_init((sem_t *)sem->hdl, 0, count);
    return OK;
}